

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.cpp
# Opt level: O1

Aggregate * __thiscall
hta::Metric::aggregate(Aggregate *__return_storage_ptr__,Metric *this,TimePoint begin,TimePoint end)

{
  bool bVar1;
  Aggregate other;
  Aggregate other_00;
  Aggregate other_01;
  undefined4 extraout_var;
  Aggregate *__return_storage_ptr___00;
  duration extraout_RDX;
  time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> begin_00;
  long lVar2;
  duration dVar3;
  duration begin_01;
  long lVar4;
  Duration local_140;
  time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> local_138;
  Aggregate local_120;
  Aggregate local_f0;
  Aggregate local_c0;
  Aggregate local_90;
  Aggregate local_60;
  
  check_read(this);
  if ((long)end.
            super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
            .__d.__r <=
      (long)begin.
            super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
            .__d.__r) {
    throw_exception<hta::Exception,char_const*,hta::Clock::time_point,char_const*,hta::Clock::time_point>
              ("invalid request: begin timestamp ",
               (time_point)
               begin.
               super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
               .__d.__r," larger than end timestamp ",
               (time_point)
               end.
               super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
               .__d.__r);
  }
  check_read(this);
  dVar3.__r._0_4_ =
       (*((this->storage_metric_)._M_t.
          super___uniq_ptr_impl<hta::storage::Metric,_std::default_delete<hta::storage::Metric>_>.
          _M_t.
          super__Tuple_impl<0UL,_hta::storage::Metric_*,_std::default_delete<hta::storage::Metric>_>
          .super__Head_base<0UL,_hta::storage::Metric_*,_false>._M_head_impl)->_vptr_Metric[0xc])();
  dVar3.__r._4_4_ = extraout_var;
  if (extraout_RDX.__r <
      (long)begin.
            super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
            .__d.__r ||
      (long)end.
            super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
            .__d.__r <= dVar3.__r) {
    __return_storage_ptr__->minimum = 0.0;
    __return_storage_ptr__->maximum = 0.0;
    __return_storage_ptr__->integral = 0.0;
    (__return_storage_ptr__->active_time).__r = 0;
    __return_storage_ptr__->sum = 0.0;
    __return_storage_ptr__->count = 0;
    __return_storage_ptr__->minimum = INFINITY;
    __return_storage_ptr__->maximum = -INFINITY;
  }
  else {
    if ((long)begin.
              super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              .__d.__r < dVar3.__r) {
      begin.super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
      .__d.__r = (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                 )(time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                   )dVar3.__r;
    }
    if (extraout_RDX.__r <
        (long)end.
              super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              .__d.__r) {
      end.super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.
      __d.__r = (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>)
                (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>)
                extraout_RDX.__r;
    }
    local_140.__r = (this->interval_min_).__r;
    lVar2 = (long)begin.
                  super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                  .__d.__r + local_140.__r + -1;
    if ((lVar2 < 0) ||
       ((long)end.
              super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              .__d.__r < 0)) {
LAB_00175db8:
      __assert_fail("time.time_since_epoch().count() >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/include/hta/types.hpp"
                    ,0x92,"TimePoint hta::interval_begin(TimePoint, Duration)");
    }
    local_138.__d.__r = (duration)(lVar2 - lVar2 % local_140.__r);
    begin_00.__d.__r =
         (duration)
         ((long)end.
                super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                .__d.__r -
         (long)end.
               super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
               .__d.__r % local_140.__r);
    if ((long)local_138.__d.__r < (long)begin_00.__d.__r) {
      __return_storage_ptr__->minimum = INFINITY;
      __return_storage_ptr__->maximum = -INFINITY;
      __return_storage_ptr__->sum = 0.0;
      __return_storage_ptr__->count = 0;
      __return_storage_ptr__->integral = 0.0;
      (__return_storage_ptr__->active_time).__r = 0;
      if ((long)local_138.__d.__r <
          (long)begin.
                super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                .__d.__r) {
        __assert_fail("begin <= next_begin",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/src/metric.cpp"
                      ,0xc3,"Aggregate hta::Metric::aggregate(hta::TimePoint, hta::TimePoint)");
      }
      aggregate_raw(&local_60,this,begin,(TimePoint)local_138.__d.__r);
      other.maximum = local_60.maximum;
      other.minimum = local_60.minimum;
      other.sum = local_60.sum;
      other.count = local_60.count;
      other.integral = local_60.integral;
      other.active_time.__r = local_60.active_time.__r;
      Aggregate::operator+=(__return_storage_ptr__,other);
      aggregate_raw(&local_90,this,(TimePoint)begin_00.__d.__r,end);
      other_00.maximum = local_90.maximum;
      other_00.minimum = local_90.minimum;
      other_00.sum = local_90.sum;
      other_00.count = local_90.count;
      other_00.integral = local_90.integral;
      other_00.active_time.__r = local_90.active_time.__r;
      Aggregate::operator+=(__return_storage_ptr__,other_00);
      do {
        lVar2 = (this->interval_factor_).factor_;
        lVar4 = lVar2 * local_140.__r;
        if (SEXT816(lVar4) != SEXT816(lVar2) * SEXT816(local_140.__r)) {
          throw_exception<hta::Exception,char_const*>
                    ("integer overflow during interval multiplication");
        }
        lVar2 = (long)local_138.__d.__r + lVar4 + -1;
        if (lVar2 < 0) goto LAB_00175db8;
        dVar3.__r = lVar2 - lVar2 % lVar4;
        if (dVar3.__r < (long)local_138.__d.__r) {
          __assert_fail("begin <= next_begin",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/src/metric.cpp"
                        ,0xcf,"Aggregate hta::Metric::aggregate(hta::TimePoint, hta::TimePoint)");
        }
        if ((long)begin_00.__d.__r < 0) goto LAB_00175db8;
        begin_01 = begin_00.__d.__r - (long)begin_00.__d.__r % lVar4;
        bVar1 = lVar4 <= (this->interval_max_).__r;
        if (dVar3.__r < begin_01.__r && bVar1) {
          aggregate_interval(&local_120,this,(TimePoint)local_138.__d.__r,(TimePoint)dVar3.__r,
                             local_140);
          other_01.maximum = local_120.maximum;
          other_01.minimum = local_120.minimum;
          other_01.sum = local_120.sum;
          other_01.count = local_120.count;
          other_01.integral = local_120.integral;
          other_01.active_time.__r = local_120.active_time.__r;
          Aggregate::operator+=(__return_storage_ptr__,other_01);
          aggregate_interval(&local_f0,this,(TimePoint)begin_01.__r,(TimePoint)begin_00.__d.__r,
                             local_140);
          __return_storage_ptr___00 = &local_f0;
          begin_00.__d.__r = (duration)(duration)begin_01.__r;
          local_140.__r = lVar4;
          local_138.__d.__r = (duration)(duration)dVar3.__r;
        }
        else {
          __return_storage_ptr___00 = &local_c0;
          aggregate_interval(__return_storage_ptr___00,this,(TimePoint)local_138.__d.__r,
                             (TimePoint)begin_00.__d.__r,local_140);
        }
        Aggregate::operator+=(__return_storage_ptr__,*__return_storage_ptr___00);
      } while (dVar3.__r < begin_01.__r && bVar1);
      if ((__return_storage_ptr__->active_time).__r !=
          (long)end.
                super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                .__d.__r -
          (long)begin.
                super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                .__d.__r) {
        __assert_fail("a.active_time == expected_active_time",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/src/metric.cpp"
                      ,0xe5,"Aggregate hta::Metric::aggregate(hta::TimePoint, hta::TimePoint)");
      }
    }
    else {
      aggregate_raw(__return_storage_ptr__,this,begin,end);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Aggregate Metric::aggregate(hta::TimePoint begin, hta::TimePoint end)
{
    check_read();
    if (begin >= end)
    {
        throw_exception("invalid request: begin timestamp ", begin, " larger than end timestamp ",
                        end);
    }
    // We must cap the end or we use intervals that are not yet completely written
    auto r = range();

    if (end <= r.first || begin > r.second)
    {
        // Really, nothing to see here if the first point isn't even in the interval
        return {};
    }

    // TODO We could further optimize requests from (before) the beginning of time by using the
    // incomplete intervals of upper levels rather than piecing together raw/low ones
    begin = std::clamp(begin, r.first, r.second);
    // We never consider anything after the last point in the data
    end = std::clamp(end, r.first, r.second);
    [[maybe_unused]] const auto expected_active_time = end - begin;

    auto interval = interval_min_;
    auto next_begin = interval_end(begin - Duration(1), interval);
    auto next_end = interval_begin(end, interval);

    if (next_begin >= next_end)
    {
        // No need to go to any intervals or do any splits, just one raw chunk
        return aggregate_raw(begin, end);
    }

    Aggregate a;
    assert(begin <= next_begin);
    a += aggregate_raw(begin, next_begin);
    begin = next_begin;

    assert(next_end <= end);
    a += aggregate_raw(next_end, end);
    end = next_end;

    while (true)
    {
        auto next_interval = interval * interval_factor_;
        next_begin = interval_end(begin - Duration(1), next_interval);
        assert(begin <= next_begin);
        next_end = interval_begin(end, next_interval);
        assert(next_end <= end);

        if (next_interval > interval_max_ || next_begin >= next_end)
        {
            // Finally use the contiguous block
            a += aggregate_interval(begin, end, interval);
            break;
        }

        // add left aggregates
        a += aggregate_interval(begin, next_begin, interval);
        begin = next_begin;

        // add right aggregates
        a += aggregate_interval(next_end, end, interval);
        end = next_end;

        interval = next_interval;
    }

    assert(a.active_time == expected_active_time);
    return a;
}